

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_addRows
          (HModel *this,int nrows,double *XrowLower,double *XrowUpper,int nnonz,int *XARstart,
          int *XARindex,double *XARvalue)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int col_2;
  int el_2;
  int lEl;
  int fEl;
  int row_1;
  int el_1;
  int AstartColp1;
  int col_1;
  int nwEl;
  int nwNnonz;
  int col;
  int el;
  vector<int,_std::allocator<int>_> Alength;
  int cuNnonz;
  int row;
  int nwNumRow;
  size_type in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  value_type vVar7;
  int local_98;
  int local_8c;
  int local_88;
  int local_80;
  int local_7c;
  int local_70;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  int local_38;
  
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",(ulong)in_ESI,(ulong)in_R8D);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  printf("H2DEBUG is being set OK\n");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",(ulong)in_ESI,(ulong)in_R8D);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  if (in_ESI != 0) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    for (local_38 = 0; local_38 < (int)in_ESI; local_38 = local_38 + 1) {
      vVar7 = *(value_type *)(in_RDX + (long)local_38 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                          (long)(*(int *)(in_RDI + 0x610) + local_38));
      *pvVar4 = vVar7;
      vVar7 = *(value_type *)(in_RCX + (long)local_38 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                          (long)(*(int *)(in_RDI + 0x610) + local_38));
      *pvVar4 = vVar7;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x720),
                          (long)(*(int *)(in_RDI + 0x610) + local_38));
      *pvVar4 = 1.0;
    }
    if (0 < (int)in_R8D) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                          (long)*(int *)(in_RDI + 0x60c));
      in_stack_ffffffffffffffc4 = *pvVar5;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1837be);
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08,(value_type *)0x1837e7);
      for (local_70 = 0; local_70 < (int)in_R8D; local_70 = local_70 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                            (long)*(int *)(in_stack_00000008 + (long)local_70 * 4));
        *pvVar5 = *pvVar5 + 1;
      }
      local_7c = in_stack_ffffffffffffffc4 + in_R8D;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar2 = *(int *)(in_RDI + 0x60c);
      while (iVar3 = local_7c, local_80 = iVar2 + -1, -1 < local_80) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                            (long)local_80);
        local_7c = local_7c - *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)iVar2);
        local_88 = *pvVar5;
        while( true ) {
          local_88 = local_88 + -1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_80);
          if (local_88 < *pvVar5) break;
          local_7c = local_7c + -1;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_88);
          vVar6 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_7c);
          *pvVar5 = vVar6;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)local_88);
          vVar7 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)local_7c);
          *pvVar4 = vVar7;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)iVar2);
        *pvVar5 = iVar3;
        iVar2 = local_80;
      }
      for (local_8c = 0; local_8c < (int)in_ESI; local_8c = local_8c + 1) {
        local_98 = *(int *)(in_R9 + (long)local_8c * 4);
        in_stack_ffffffffffffff24 = in_R8D;
        if (local_8c < (int)(in_ESI - 1)) {
          in_stack_ffffffffffffff24 = *(uint *)(in_R9 + (long)(local_8c + 1) * 4);
        }
        iVar2 = in_stack_ffffffffffffff24 - 1;
        for (; local_98 <= iVar2; local_98 = local_98 + 1) {
          iVar3 = *(int *)(in_stack_00000008 + (long)local_98 * 4);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                              (long)(iVar3 + 1));
          vVar6 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                              (long)iVar3);
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                              (long)iVar3);
          *pvVar5 = *pvVar5 + -1;
          iVar3 = *(int *)(in_RDI + 0x610) + local_8c;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),
                              (long)(vVar6 - iVar1));
          *pvVar5 = iVar3;
          vVar7 = *(value_type *)(in_stack_00000010 + (long)local_98 * 8);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)(vVar6 - iVar1));
          *pvVar4 = vVar7;
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    *(uint *)(in_RDI + 0x610) = in_ESI + *(int *)(in_RDI + 0x610);
    *(uint *)(in_RDI + 0x614) = in_ESI + *(int *)(in_RDI + 0x614);
    extendWithLogicalBasis
              ((HModel *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void HModel::util_addRows(int nrows, const double* XrowLower, const double* XrowUpper,
			  int nnonz, const int* XARstart, const int* XARindex, const double* XARvalue) {
  assert(nrows >= 0);
  assert(nnonz >= 0);
  assert(nnonz == 0 || numCol > 0);
#ifdef JAJH_dev
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif

#ifdef H2DEBUG
  printf("H2DEBUG is being set OK\n");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif


  if (nrows==0) return;

  int nwNumRow = numRow + nrows;
  rowLower.resize(nwNumRow);
  rowUpper.resize(nwNumRow);
  rowScale.resize(nwNumRow);

  for (int row = 0; row < nrows; row++) {
    rowLower[numRow+row] = XrowLower[row];
    rowUpper[numRow+row] = XrowUpper[row];
    rowScale[numRow+row] = 1.0;
  }
  //NB SCIP doesn't have XARstart[nrows] defined, so have to use nnonz for last entry
  if (nnonz > 0) {
    int cuNnonz = Astart[numCol];
    vector<int> Alength;
    Alength.assign(numCol, 0);
    for (int el = 0; el < nnonz; el++) {
      int col = XARindex[el];
      //      printf("El %2d: adding entry in column %2d\n", el, col); cout << flush;
#ifdef H2DEBUG
      assert(col >= 0);
      assert(col < numCol);
#endif
      Alength[col]++;
    }
    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new rows
    //Shift the existing columns to make space for the new entries
    int nwEl = nwNnonz;
    for (int col = numCol-1; col >= 0; col--) {
      //printf("Column %2d has additional length %2d\n", col, Alength[col]);cout << flush;
      int AstartColp1 = nwEl;
      nwEl -= Alength[col];
      //printf("Shift: nwEl = %2d\n", nwEl); cout << flush;
      for (int el = Astart[col+1]-1; el >= Astart[col]; el--) {
	nwEl--;
	//printf("Shift: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = Aindex[el];
	Avalue[nwEl] = Avalue[el];
      }
      Astart[col+1] = AstartColp1;
    }
    //printf("After shift: nwEl = %2d\n", nwEl); cout << flush;
    assert(nwEl == 0);
    //util_reportColMtx(numCol, Astart, Aindex, Avalue);

    //Insert the new entries
    for (int row = 0; row < nrows; row++) {
      int fEl = XARstart[row];
      int lEl = (row < nrows-1 ? XARstart[row+1] : nnonz) - 1;
      for (int el = fEl; el <= lEl; el++) {
	int col = XARindex[el];
	nwEl = Astart[col+1]-Alength[col];
	Alength[col]--;
	//printf("Insert: row = %2d; col = %2d; Astart[col+1]-Alength[col] = %2d; Alength[col] = %2d; nwEl = %2d\n", row, col, Astart[col+1]-Alength[col], Alength[col], nwEl); cout << flush;
	assert(nwEl >= 0);
	assert(el >= 0);
	//printf("Insert: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = numRow + row;
	Avalue[nwEl] = XARvalue[el];
      }
    }
  }
  //Increase the number of rows and total number of variables in the model
  numRow += nrows;
  numTot += nrows;

  //Update the basis and work vectors correponding to new basic rows
  extendWithLogicalBasis(numCol, -1, numRow-nrows, numRow-1);

}